

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

duckdb_state
duckdb_add_aggregate_function_to_set
          (duckdb_aggregate_function_set set,duckdb_aggregate_function function)

{
  AggregateFunction local_140;
  
  if (function != (duckdb_aggregate_function)0x0 && set != (duckdb_aggregate_function_set)0x0) {
    duckdb::AggregateFunction::AggregateFunction(&local_140,(AggregateFunction *)function);
    std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
               (set + 0x20),&local_140);
    duckdb::AggregateFunction::~AggregateFunction(&local_140);
  }
  return (uint)(function == (duckdb_aggregate_function)0x0 ||
               set == (duckdb_aggregate_function_set)0x0);
}

Assistant:

duckdb_state duckdb_add_aggregate_function_to_set(duckdb_aggregate_function_set set,
                                                  duckdb_aggregate_function function) {
	if (!set || !function) {
		return DuckDBError;
	}
	auto &aggregate_function_set = duckdb::GetCAggregateFunctionSet(set);
	auto &aggregate_function = GetCAggregateFunction(function);
	aggregate_function_set.AddFunction(aggregate_function);
	return DuckDBSuccess;
}